

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

void mjs::anon_unknown_33::make_immutable(object_ptr *o,property_attribute attr)

{
  string *name;
  bool bVar1;
  property_attribute attr_00;
  object *poVar2;
  object *poVar3;
  wstring_view wVar4;
  wstring_view local_b0;
  value local_a0;
  wstring_view local_78 [2];
  property_attribute local_54;
  reference psStack_50;
  property_attribute attrs;
  string *p;
  iterator __end2;
  iterator __begin2;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range2;
  property_attribute attr_local;
  object_ptr *o_local;
  
  poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
  object::own_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2,poVar2,false);
  __end2 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                     ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
  p = (string *)
      std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                *)&p);
    if (!bVar1) break;
    psStack_50 = __gnu_cxx::
                 __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                 ::operator*(&__end2);
    poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
    wVar4 = string::view(psStack_50);
    local_78[0] = wVar4;
    local_54 = object::own_property_attributes(poVar2,local_78);
    bVar1 = has_attributes(local_54,attr);
    if (!bVar1) {
      poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
      name = psStack_50;
      poVar3 = gc_heap_ptr<mjs::object>::operator->(o);
      wVar4 = string::view(psStack_50);
      local_b0 = wVar4;
      (**poVar3->_vptr_object)(&local_a0,poVar3,&local_b0);
      attr_00 = operator|(local_54,attr);
      object::redefine_own_property(poVar2,name,&local_a0,attr_00);
      value::~value(&local_a0);
    }
    __gnu_cxx::
    __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>::
    operator++(&__end2);
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin2);
  poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
  object::prevent_extensions(poVar2);
  return;
}

Assistant:

void make_immutable(const object_ptr& o, property_attribute attr) {
    for (const auto& p : o->own_property_names(false)) {
        const auto attrs = o->own_property_attributes(p.view());
        if (!has_attributes(attrs, attr)) {
            o->redefine_own_property(p, o->get(p.view()), attrs | attr);
        }
    }
    o->prevent_extensions();
}